

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  Nonnull<const_char_*> pcVar1;
  void *v2;
  void *v1;
  
  v1 = (void *)(message1->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v1 & 1) != 0) {
    v1 = *(void **)((ulong)v1 & 0xfffffffffffffffe);
  }
  v2 = (void *)(message2->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v2 & 1) != 0) {
    v2 = *(void **)((ulong)v2 & 0xfffffffffffffffe);
  }
  if (v1 == v2) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,v2,"message1->GetArena() == message2->GetArena()");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    SwapFieldsImpl<true>(this,message1,message2,fields);
    return;
  }
  UnsafeShallowSwapFields();
}

Assistant:

void Reflection::UnsafeShallowSwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(message1->GetArena(), message2->GetArena());

  SwapFieldsImpl<true>(message1, message2, fields);
}